

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O0

int __thiscall
particleSamples::read_in_particle_samples_UrQMD_mixed_event_zipped(particleSamples *this)

{
  int iVar1;
  _Ios_Openmode _Var2;
  void *pvVar3;
  istream *piVar4;
  string *type;
  istream *piVar5;
  long in_RDI;
  particle_info temp_particle_info;
  stringstream temp2;
  int ipart;
  stringstream temp1;
  int num_particles;
  int ievent;
  int urqmd_charge;
  int urqmd_iso3;
  int urqmd_pid;
  int parent_proc_type;
  double dummy;
  int n_particle;
  string temp_string;
  char (*in_stack_fffffffffffff978) [22];
  allocator *in_stack_fffffffffffff980;
  value_type *in_stack_fffffffffffff988;
  allocator *in_stack_fffffffffffff990;
  vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
  *in_stack_fffffffffffff998;
  particleSamples *in_stack_fffffffffffff9a0;
  pretty_ostream *in_stack_fffffffffffffa18;
  particleSamples *in_stack_fffffffffffffa20;
  allocator local_4f1;
  string local_4f0 [32];
  gzFile in_stack_fffffffffffffb30;
  particleSamples *in_stack_fffffffffffffb38;
  allocator local_4a1;
  string local_4a0 [39];
  allocator local_479;
  string local_478 [32];
  int local_458;
  double local_450 [2];
  double local_440;
  double local_438;
  double local_430;
  double local_428;
  double local_420;
  double local_418;
  double local_410;
  double local_408 [5];
  stringstream local_3e0 [392];
  string local_258 [36];
  int local_234;
  string local_230 [32];
  stringstream local_210 [392];
  void *local_88;
  string local_70 [32];
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  double local_38;
  int local_2c;
  string local_28 [40];
  
  clear_out_previous_record(in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
  std::__cxx11::string::string(local_28);
  local_4c = 0;
  local_50 = 0;
  while (local_50 < *(int *)(in_RDI + 0x5f0)) {
    gz_readline_abi_cxx11_(in_stack_fffffffffffffb38,in_stack_fffffffffffffb30);
    std::__cxx11::string::operator=(local_28,local_70);
    std::__cxx11::string::~string(local_70);
    iVar1 = gzeof(*(undefined8 *)(in_RDI + 0x5e8));
    if (iVar1 != 0) break;
    pvVar3 = operator_new(0x18);
    std::vector<particle_info,_std::allocator<particle_info>_>::vector
              ((vector<particle_info,_std::allocator<particle_info>_> *)0x14ac30);
    local_88 = pvVar3;
    std::
    vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
    ::push_back((vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                 *)in_stack_fffffffffffff980,(value_type *)in_stack_fffffffffffff978);
    _Var2 = std::operator|(_S_out,_S_in);
    std::__cxx11::stringstream::stringstream(local_210,local_28,_Var2);
    std::istream::operator>>((istream *)local_210,&local_2c);
    gz_readline_abi_cxx11_(in_stack_fffffffffffffb38,in_stack_fffffffffffffb30);
    std::__cxx11::string::operator=(local_28,local_230);
    std::__cxx11::string::~string(local_230);
    for (local_234 = 0; local_234 < local_2c; local_234 = local_234 + 1) {
      gz_readline_abi_cxx11_(in_stack_fffffffffffffb38,in_stack_fffffffffffffb30);
      std::__cxx11::string::operator=(local_28,local_258);
      std::__cxx11::string::~string(local_258);
      _Var2 = std::operator|(_S_out,_S_in);
      std::__cxx11::stringstream::stringstream(local_3e0,local_28,_Var2);
      piVar4 = (istream *)std::istream::operator>>((istream *)local_3e0,&local_40);
      piVar4 = (istream *)std::istream::operator>>(piVar4,&local_44);
      piVar4 = (istream *)std::istream::operator>>(piVar4,&local_48);
      piVar4 = (istream *)std::istream::operator>>(piVar4,&local_38);
      piVar4 = (istream *)std::istream::operator>>(piVar4,&local_38);
      std::istream::operator>>(piVar4,&local_3c);
      piVar4 = (istream *)std::istream::operator>>((istream *)local_3e0,local_450);
      type = (string *)std::istream::operator>>(piVar4,local_408);
      piVar5 = (istream *)std::istream::operator>>((istream *)type,&local_420);
      piVar5 = (istream *)std::istream::operator>>(piVar5,&local_418);
      piVar5 = (istream *)std::istream::operator>>(piVar5,&local_410);
      piVar5 = (istream *)std::istream::operator>>(piVar5,&local_428);
      piVar5 = (istream *)std::istream::operator>>(piVar5,&local_440);
      piVar5 = (istream *)std::istream::operator>>(piVar5,&local_438);
      std::istream::operator>>(piVar5,&local_430);
      local_458 = get_pdg_id(in_stack_fffffffffffffa20,
                             (int)((ulong)in_stack_fffffffffffffa18 >> 0x20),
                             (int)in_stack_fffffffffffffa18);
      if (local_458 == 0) {
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffff980,
                   (char (*) [7])in_stack_fffffffffffff978);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffff980,(int *)in_stack_fffffffffffff978);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_478,"error",&local_479);
        pretty_ostream::flush((pretty_ostream *)piVar4,type);
        std::__cxx11::string::~string(local_478);
        std::allocator<char>::~allocator((allocator<char> *)&local_479);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffff980,
                   (char (*) [14])in_stack_fffffffffffff978);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffff980,(int *)in_stack_fffffffffffff978);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffff980,
                   (char (*) [11])in_stack_fffffffffffff978);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffff980,(int *)in_stack_fffffffffffff978);
        in_stack_fffffffffffffa20 = (particleSamples *)(in_RDI + 0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_4a0,"error",&local_4a1);
        pretty_ostream::flush((pretty_ostream *)piVar4,type);
        std::__cxx11::string::~string(local_4a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
        in_stack_fffffffffffffa18 =
             pretty_ostream::operator<<
                       ((pretty_ostream *)in_stack_fffffffffffff980,
                        (char (*) [8])in_stack_fffffffffffff978);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffff980,(double *)in_stack_fffffffffffff978);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffff980,
                   (char (*) [7])in_stack_fffffffffffff978);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffff980,(double *)in_stack_fffffffffffff978);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffff980,
                   (char (*) [8])in_stack_fffffffffffff978);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffff980,(double *)in_stack_fffffffffffff978);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffff980,
                   (char (*) [8])in_stack_fffffffffffff978);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffff980,(double *)in_stack_fffffffffffff978);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffff980,
                   (char (*) [8])in_stack_fffffffffffff978);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffff980,(double *)in_stack_fffffffffffff978);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffff980,
                   (char (*) [7])in_stack_fffffffffffff978);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffff980,(double *)in_stack_fffffffffffff978);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffff980,
                   (char (*) [7])in_stack_fffffffffffff978);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffff980,(double *)in_stack_fffffffffffff978);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffff980,
                   (char (*) [7])in_stack_fffffffffffff978);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffff980,(double *)in_stack_fffffffffffff978);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffff980,
                   (char (*) [7])in_stack_fffffffffffff978);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffff980,(double *)in_stack_fffffffffffff978);
        in_stack_fffffffffffff988 = (value_type *)(in_RDI + 0x30);
        in_stack_fffffffffffff990 = (allocator *)&stack0xfffffffffffffb37;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&stack0xfffffffffffffb38,"error",in_stack_fffffffffffff990);
        pretty_ostream::flush((pretty_ostream *)piVar4,type);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffb38);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffb37);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffff980,in_stack_fffffffffffff978);
        in_stack_fffffffffffff978 = (char (*) [22])(in_RDI + 0x30);
        in_stack_fffffffffffff980 = &local_4f1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_4f0,"error",in_stack_fffffffffffff980);
        pretty_ostream::flush((pretty_ostream *)piVar4,type);
        std::__cxx11::string::~string(local_4f0);
        std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
      }
      else {
        std::
        vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
        ::operator[](*(vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                       **)(in_RDI + 0x698),(long)local_4c);
        std::vector<particle_info,_std::allocator<particle_info>_>::push_back
                  ((vector<particle_info,_std::allocator<particle_info>_> *)
                   in_stack_fffffffffffff990,in_stack_fffffffffffff988);
      }
      std::__cxx11::stringstream::~stringstream(local_3e0);
    }
    local_50 = local_2c + local_50;
    local_4c = local_4c + 1;
    std::__cxx11::stringstream::~stringstream(local_210);
  }
  std::__cxx11::string::~string(local_28);
  return 0;
}

Assistant:

int particleSamples::read_in_particle_samples_UrQMD_mixed_event_zipped() {
    // clean out the previous record
    clear_out_previous_record(full_particle_list_mixed_event);

    std::string temp_string;
    int n_particle;
    double dummy;
    int parent_proc_type;
    int urqmd_pid, urqmd_iso3, urqmd_charge;
    int ievent = 0;
    int num_particles = 0;
    while (num_particles < event_buffer_size) {
        temp_string = gz_readline(inputfile_mixed_event_gz);

        if (gzeof(inputfile_mixed_event_gz)) break;

        full_particle_list_mixed_event->push_back(new vector<particle_info>);

        // get number of particles within the event
        std::stringstream temp1(temp_string);
        temp1 >> n_particle;
        // then get one useless line
        temp_string = gz_readline(inputfile_mixed_event_gz);

        for (int ipart = 0; ipart < n_particle; ipart++) {
            temp_string = gz_readline(inputfile_mixed_event_gz);
            std::stringstream temp2(temp_string);
            temp2 >> urqmd_pid >> urqmd_iso3 >> urqmd_charge >> dummy >> dummy
                >> parent_proc_type;

            particle_info temp_particle_info;
            temp2 >> temp_particle_info.mass >> temp_particle_info.t
                >> temp_particle_info.x >> temp_particle_info.y
                >> temp_particle_info.z >> temp_particle_info.E
                >> temp_particle_info.px >> temp_particle_info.py
                >> temp_particle_info.pz;
            temp_particle_info.monval = get_pdg_id(urqmd_pid, urqmd_iso3);
            if (temp_particle_info.monval == 0) {
                messager << "nev = " << ievent;
                messager.flush("error");
                messager << "nparticles = " << n_particle
                         << ", ipart = " << ipart;
                messager.flush("error");
                messager << "mass = " << temp_particle_info.mass
                         << ", E = " << temp_particle_info.E
                         << ", px = " << temp_particle_info.px
                         << ", py = " << temp_particle_info.py
                         << ", pz = " << temp_particle_info.pz
                         << ", t = " << temp_particle_info.t
                         << ", x = " << temp_particle_info.x
                         << ", y = " << temp_particle_info.y
                         << ", z = " << temp_particle_info.z;
                messager.flush("error");
                messager << "Ignore this particle!";
                messager.flush("error");
            } else {
                (*full_particle_list_mixed_event)[ievent]->push_back(
                    temp_particle_info);
            }
        }
        num_particles += n_particle;
        ievent++;
    }
    return (0);
}